

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.hpp
# Opt level: O3

string * __thiscall
toml::detail::region::line_abi_cxx11_(string *__return_storage_ptr__,region *this)

{
  bool bVar1;
  const_iterator this_00;
  const_iterator cVar2;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> first;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> in_RCX;
  
  bVar1 = contain_newline(this);
  this_00 = line_begin(this);
  if (bVar1) {
    cVar2 = line_begin(this);
    first = std::
            __find_if<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      (cVar2._M_current,(this->last_)._M_current);
  }
  else {
    first._M_current = (char *)line_end(this);
  }
  make_string<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
            (__return_storage_ptr__,(detail *)this_00._M_current,first,in_RCX);
  return __return_storage_ptr__;
}

Assistant:

std::string line() const override
    {
        if(this->contain_newline())
        {
            return make_string(this->line_begin(),
                    std::find(this->line_begin(), this->last(), '\n'));
        }
        return make_string(this->line_begin(), this->line_end());
    }